

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controls.cpp
# Opt level: O0

void __thiscall CControls::OnConsoleInit(CControls *this)

{
  int iVar1;
  IConsole *pIVar2;
  CControls *in_RDI;
  
  pIVar2 = CComponent::Console((CComponent *)0x158e3c);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"+left","",2,ConKeyInputState,&in_RDI->m_InputDirectionLeft,"Move left");
  pIVar2 = CComponent::Console((CComponent *)0x158e7d);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"+right","",2,ConKeyInputState,&in_RDI->m_InputDirectionRight,"Move right");
  pIVar2 = CComponent::Console((CComponent *)0x158ebe);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"+jump","",2,ConKeyInputState,&(in_RDI->m_InputData).m_Jump,"Jump");
  pIVar2 = CComponent::Console((CComponent *)0x158f03);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"+hook","",2,ConKeyInputState,&(in_RDI->m_InputData).m_Hook,"Hook");
  pIVar2 = CComponent::Console((CComponent *)0x158f48);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"+fire","",2,ConKeyInputCounter,&(in_RDI->m_InputData).m_Fire,"Fire");
  if (OnConsoleInit()::s_Set == '\0') {
    iVar1 = __cxa_guard_acquire(&OnConsoleInit()::s_Set);
    if (iVar1 != 0) {
      OnConsoleInit::s_Set.m_pVariable = &(in_RDI->m_InputData).m_WantedWeapon;
      OnConsoleInit::s_Set.m_Value = 1;
      OnConsoleInit::s_Set.m_pControls = in_RDI;
      __cxa_guard_release(&OnConsoleInit()::s_Set);
    }
  }
  pIVar2 = CComponent::Console((CComponent *)0x158fd8);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"+weapon1","",2,ConKeyInputSet,&OnConsoleInit::s_Set,"Switch to hammer");
  if (OnConsoleInit()::s_Set == '\0') {
    iVar1 = __cxa_guard_acquire(&OnConsoleInit()::s_Set);
    if (iVar1 != 0) {
      OnConsoleInit()::s_Set.m_pVariable = &(in_RDI->m_InputData).m_WantedWeapon;
      OnConsoleInit()::s_Set.m_Value = 2;
      OnConsoleInit()::s_Set.m_pControls = in_RDI;
      __cxa_guard_release(&OnConsoleInit()::s_Set);
    }
  }
  pIVar2 = CComponent::Console((CComponent *)0x159062);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"+weapon2","",2,ConKeyInputSet,&OnConsoleInit()::s_Set,"Switch to gun");
  if (OnConsoleInit()::s_Set == '\0') {
    iVar1 = __cxa_guard_acquire(&OnConsoleInit()::s_Set);
    if (iVar1 != 0) {
      OnConsoleInit()::s_Set.m_pVariable = &(in_RDI->m_InputData).m_WantedWeapon;
      OnConsoleInit()::s_Set.m_Value = 3;
      OnConsoleInit()::s_Set.m_pControls = in_RDI;
      __cxa_guard_release(&OnConsoleInit()::s_Set);
    }
  }
  pIVar2 = CComponent::Console((CComponent *)0x1590ec);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"+weapon3","",2,ConKeyInputSet,&OnConsoleInit()::s_Set,"Switch to shotgun");
  if (OnConsoleInit()::s_Set == '\0') {
    iVar1 = __cxa_guard_acquire(&OnConsoleInit()::s_Set);
    if (iVar1 != 0) {
      OnConsoleInit()::s_Set.m_pVariable = &(in_RDI->m_InputData).m_WantedWeapon;
      OnConsoleInit()::s_Set.m_Value = 4;
      OnConsoleInit()::s_Set.m_pControls = in_RDI;
      __cxa_guard_release(&OnConsoleInit()::s_Set);
    }
  }
  pIVar2 = CComponent::Console((CComponent *)0x159176);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"+weapon4","",2,ConKeyInputSet,&OnConsoleInit()::s_Set,"Switch to grenade");
  if (OnConsoleInit()::s_Set == '\0') {
    iVar1 = __cxa_guard_acquire(&OnConsoleInit()::s_Set);
    if (iVar1 != 0) {
      OnConsoleInit()::s_Set.m_pVariable = &(in_RDI->m_InputData).m_WantedWeapon;
      OnConsoleInit()::s_Set.m_Value = 5;
      OnConsoleInit()::s_Set.m_pControls = in_RDI;
      __cxa_guard_release(&OnConsoleInit()::s_Set);
    }
  }
  pIVar2 = CComponent::Console((CComponent *)0x159200);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"+weapon5","",2,ConKeyInputSet,&OnConsoleInit()::s_Set,"Switch to laser");
  if (OnConsoleInit()::s_Set == '\0') {
    iVar1 = __cxa_guard_acquire(&OnConsoleInit()::s_Set);
    if (iVar1 != 0) {
      OnConsoleInit()::s_Set.m_pVariable = &(in_RDI->m_InputData).m_NextWeapon;
      OnConsoleInit()::s_Set.m_Value = 0;
      OnConsoleInit()::s_Set.m_pControls = in_RDI;
      __cxa_guard_release(&OnConsoleInit()::s_Set);
    }
  }
  pIVar2 = CComponent::Console((CComponent *)0x15928a);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"+nextweapon","",2,ConKeyInputNextPrevWeapon,&OnConsoleInit()::s_Set,
             "Switch to next weapon");
  if (OnConsoleInit()::s_Set == '\0') {
    iVar1 = __cxa_guard_acquire(&OnConsoleInit()::s_Set);
    if (iVar1 != 0) {
      OnConsoleInit()::s_Set.m_pVariable = &(in_RDI->m_InputData).m_PrevWeapon;
      OnConsoleInit()::s_Set.m_Value = 0;
      OnConsoleInit()::s_Set.m_pControls = in_RDI;
      __cxa_guard_release(&OnConsoleInit()::s_Set);
    }
  }
  pIVar2 = CComponent::Console((CComponent *)0x159314);
  (*(pIVar2->super_IInterface)._vptr_IInterface[8])
            (pIVar2,"+prevweapon","",2,ConKeyInputNextPrevWeapon,&OnConsoleInit()::s_Set,
             "Switch to previous weapon");
  return;
}

Assistant:

void CControls::OnConsoleInit()
{
	// game commands
	Console()->Register("+left", "", CFGFLAG_CLIENT, ConKeyInputState, &m_InputDirectionLeft, "Move left");
	Console()->Register("+right", "", CFGFLAG_CLIENT, ConKeyInputState, &m_InputDirectionRight, "Move right");
	Console()->Register("+jump", "", CFGFLAG_CLIENT, ConKeyInputState, &m_InputData.m_Jump, "Jump");
	Console()->Register("+hook", "", CFGFLAG_CLIENT, ConKeyInputState, &m_InputData.m_Hook, "Hook");
	Console()->Register("+fire", "", CFGFLAG_CLIENT, ConKeyInputCounter, &m_InputData.m_Fire, "Fire");

	{ static CInputSet s_Set = {this, &m_InputData.m_WantedWeapon, 1}; Console()->Register("+weapon1", "", CFGFLAG_CLIENT, ConKeyInputSet, (void *)&s_Set, "Switch to hammer"); }
	{ static CInputSet s_Set = {this, &m_InputData.m_WantedWeapon, 2}; Console()->Register("+weapon2", "", CFGFLAG_CLIENT, ConKeyInputSet, (void *)&s_Set, "Switch to gun"); }
	{ static CInputSet s_Set = {this, &m_InputData.m_WantedWeapon, 3}; Console()->Register("+weapon3", "", CFGFLAG_CLIENT, ConKeyInputSet, (void *)&s_Set, "Switch to shotgun"); }
	{ static CInputSet s_Set = {this, &m_InputData.m_WantedWeapon, 4}; Console()->Register("+weapon4", "", CFGFLAG_CLIENT, ConKeyInputSet, (void *)&s_Set, "Switch to grenade"); }
	{ static CInputSet s_Set = {this, &m_InputData.m_WantedWeapon, 5}; Console()->Register("+weapon5", "", CFGFLAG_CLIENT, ConKeyInputSet, (void *)&s_Set, "Switch to laser"); }

	{ static CInputSet s_Set = {this, &m_InputData.m_NextWeapon, 0}; Console()->Register("+nextweapon", "", CFGFLAG_CLIENT, ConKeyInputNextPrevWeapon, (void *)&s_Set, "Switch to next weapon"); }
	{ static CInputSet s_Set = {this, &m_InputData.m_PrevWeapon, 0}; Console()->Register("+prevweapon", "", CFGFLAG_CLIENT, ConKeyInputNextPrevWeapon, (void *)&s_Set, "Switch to previous weapon"); }
}